

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int normal_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  undefined4 extraout_EDX;
  int extraout_EDX_00;
  undefined4 extraout_EDX_01;
  int extraout_EDX_02;
  undefined4 extraout_EDX_03;
  int extraout_EDX_04;
  undefined4 extraout_EDX_05;
  int extraout_EDX_06;
  undefined4 extraout_EDX_07;
  int extraout_EDX_08;
  undefined4 extraout_EDX_09;
  int extraout_EDX_10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  iVar1 = (int)end;
  if ((long)end - (long)ptr < 1) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    ppcVar3 = (char **)ptr;
    iVar1 = (*enc[3].nameLength)(enc,ptr);
    if ((iVar1 != 0) ||
       (iVar1 = (*enc[3].literalScanners[0])
                          (enc,ptr,(char *)CONCAT44(extraout_var,extraout_EDX),ppcVar3), iVar1 == 0)
       ) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 2;
    iVar1 = extraout_EDX_00;
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    ppcVar3 = (char **)ptr;
    pcVar2 = (*enc[3].skipS)(enc,ptr);
    if (((int)pcVar2 != 0) ||
       (iVar1 = (*enc[3].literalScanners[1])
                          (enc,ptr,(char *)CONCAT44(extraout_var_00,extraout_EDX_01),ppcVar3),
       iVar1 == 0)) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 3;
    iVar1 = extraout_EDX_02;
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    pcVar2 = ptr;
    iVar1 = (*enc[3].getAtts)(enc,ptr,iVar1,(ATTRIBUTE *)ptr);
    if ((iVar1 != 0) ||
       (iVar1 = (*enc[3].nameMatchesAscii)
                          (enc,ptr,(char *)CONCAT44(extraout_var_01,extraout_EDX_03),pcVar2),
       iVar1 == 0)) {
      *nextTokPtr = ptr;
      return 0;
    }
    end_local = ptr + 4;
    iVar1 = extraout_EDX_04;
    break;
  default:
    *nextTokPtr = ptr;
    return 0;
  case 9:
  case 10:
  case 0x15:
  case 0x1e:
    *nextTokPtr = ptr;
    return 0x16;
  case 0x16:
  case 0x18:
    end_local = ptr + 1;
    break;
  case 0x1d:
    *nextTokPtr = ptr;
    return 0;
  }
  do {
    if ((long)end - (long)end_local < 1) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*end_local)) {
    case 5:
      if ((long)end - (long)end_local < 2) {
        return -2;
      }
      ppcVar3 = (char **)end_local;
      iVar1 = (*enc[3].nameLength)(enc,end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (*enc[3].scanners[0])
                            (enc,end_local,(char *)CONCAT44(extraout_var_02,extraout_EDX_05),ppcVar3
                            ), iVar1 == 0)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 2;
      iVar1 = extraout_EDX_06;
      break;
    case 6:
      if ((long)end - (long)end_local < 3) {
        return -2;
      }
      ppcVar3 = (char **)end_local;
      pcVar2 = (*enc[3].skipS)(enc,end_local);
      if (((int)pcVar2 != 0) ||
         (iVar1 = (*enc[3].scanners[1])
                            (enc,end_local,(char *)CONCAT44(extraout_var_03,extraout_EDX_07),ppcVar3
                            ), iVar1 == 0)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 3;
      iVar1 = extraout_EDX_08;
      break;
    case 7:
      if ((long)end - (long)end_local < 4) {
        return -2;
      }
      ppcVar3 = (char **)end_local;
      iVar1 = (*enc[3].getAtts)(enc,end_local,iVar1,(ATTRIBUTE *)end_local);
      if ((iVar1 != 0) ||
         (iVar1 = (*enc[3].scanners[2])
                            (enc,end_local,(char *)CONCAT44(extraout_var_04,extraout_EDX_09),ppcVar3
                            ), iVar1 == 0)) {
        *nextTokPtr = end_local;
        return 0;
      }
      end_local = end_local + 4;
      iVar1 = extraout_EDX_10;
      break;
    default:
      *nextTokPtr = end_local;
      return 0;
    case 0x12:
      *nextTokPtr = end_local + 1;
      return 0x1c;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      end_local = end_local + 1;
      break;
    case 0x1d:
      *nextTokPtr = end_local;
      return 0;
    }
  } while( true );
}

Assistant:

static int PTRCALL
PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                    const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S:
  case BT_LF:
  case BT_CR:
  case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}